

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O1

void fe::operations::
     applyOperationT<fe::operations::op_blend_subtract,fe::PixelDISTANCE,fe::PixelDISTANCE>
               (op_blend_subtract *op,PixelDISTANCE *srcPixelFormat,PixelDISTANCE *destPixelFormat,
               ImageData *src,ImageData *dest)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  uint8_t *puVar5;
  int iVar6;
  uint8_t *puVar7;
  
  bVar4 = check(src,dest);
  if ((bVar4) && (iVar1 = (dest->super_fe_image).h, iVar1 != 0)) {
    iVar2 = (dest->super_fe_image).w;
    puVar7 = (dest->super_fe_image).data;
    iVar6 = 0;
    iVar3 = iVar2;
    puVar5 = puVar7;
    do {
      for (; iVar3 != 0; iVar3 = iVar3 + -1) {
        *puVar7 = '\0';
        puVar7 = puVar7 + (dest->super_fe_image).bytespp;
      }
      puVar7 = puVar5 + (dest->super_fe_image).pitch;
      iVar6 = iVar6 + 1;
      iVar3 = iVar2;
      puVar5 = puVar7;
    } while (iVar6 != iVar1);
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }